

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

MOJOSHADER_effect * MOJOSHADER_cloneEffect(MOJOSHADER_effect *effect)

{
  int iVar1;
  MOJOSHADER_malloc m_00;
  void *d_00;
  uint uVar2;
  MOJOSHADER_effect *_effect;
  MOJOSHADER_error *pMVar3;
  size_t sVar4;
  char *pcVar5;
  MOJOSHADER_effectParam *pMVar6;
  MOJOSHADER_effectAnnotation *pMVar7;
  MOJOSHADER_effectTechnique *pMVar8;
  MOJOSHADER_effectPass *pMVar9;
  MOJOSHADER_effectState *pMVar10;
  MOJOSHADER_effectObject *pMVar11;
  void *pvVar12;
  MOJOSHADER_preshader *pMVar13;
  MOJOSHADER_parseData *pMVar14;
  uint local_54;
  uint32 curSampler;
  char *stringcopy;
  uint32 siz;
  void *d;
  MOJOSHADER_malloc m;
  MOJOSHADER_effect *clone;
  uint local_20;
  int k;
  int j;
  int i;
  MOJOSHADER_effect *effect_local;
  
  m_00 = effect->malloc;
  d_00 = effect->malloc_data;
  if (((effect != (MOJOSHADER_effect *)0x0) && (effect != &MOJOSHADER_out_of_mem_effect)) &&
     (_effect = (MOJOSHADER_effect *)(*m_00)(0x78,d_00), _effect != (MOJOSHADER_effect *)0x0)) {
    memset(_effect,0,0x78);
    _effect->malloc = effect->malloc;
    _effect->free = effect->free;
    _effect->malloc_data = effect->malloc_data;
    uVar2 = effect->error_count * 0x18;
    _effect->error_count = effect->error_count;
    pMVar3 = (MOJOSHADER_error *)(*m_00)(uVar2,d_00);
    _effect->errors = pMVar3;
    if (_effect->errors != (MOJOSHADER_error *)0x0) {
      memset(_effect->errors,0,(ulong)uVar2);
      for (k = 0; k < _effect->error_count; k = k + 1) {
        sVar4 = strlen(effect->errors[k].error);
        pcVar5 = (char *)(*m_00)((int)sVar4 + 1,d_00);
        if (pcVar5 == (char *)0x0) goto LAB_00135ef3;
        strcpy(pcVar5,effect->errors[k].error);
        _effect->errors[k].error = pcVar5;
        sVar4 = strlen(effect->errors[k].filename);
        pcVar5 = (char *)(*m_00)((int)sVar4 + 1,d_00);
        if (pcVar5 == (char *)0x0) goto LAB_00135ef3;
        strcpy(pcVar5,effect->errors[k].filename);
        _effect->errors[k].filename = pcVar5;
        _effect->errors[k].error_position = effect->errors[k].error_position;
      }
      sVar4 = strlen(effect->profile);
      pcVar5 = (char *)(*m_00)((int)sVar4 + 1,d_00);
      if (pcVar5 != (char *)0x0) {
        strcpy(pcVar5,effect->profile);
        _effect->profile = pcVar5;
        uVar2 = effect->param_count * 0x50;
        _effect->param_count = effect->param_count;
        pMVar6 = (MOJOSHADER_effectParam *)(*m_00)(uVar2,d_00);
        _effect->params = pMVar6;
        if (_effect->params != (MOJOSHADER_effectParam *)0x0) {
          memset(_effect->params,0,(ulong)uVar2);
          for (k = 0; k < _effect->param_count; k = k + 1) {
            copyvalue(&_effect->params[k].value,&effect->params[k].value,m_00,d_00);
            uVar2 = effect->params[k].annotation_count << 6;
            _effect->params[k].annotation_count = effect->params[k].annotation_count;
            pMVar7 = (MOJOSHADER_effectAnnotation *)(*m_00)(uVar2,d_00);
            _effect->params[k].annotations = pMVar7;
            if (_effect->params[k].annotations == (MOJOSHADER_effectAnnotation *)0x0)
            goto LAB_00135ef3;
            memset(_effect->params[k].annotations,0,(ulong)uVar2);
            for (local_20 = 0; local_20 < _effect->params[k].annotation_count;
                local_20 = local_20 + 1) {
              copyvalue(_effect->params[k].annotations + (int)local_20,
                        effect->params[k].annotations + (int)local_20,m_00,d_00);
            }
          }
          uVar2 = effect->technique_count * 0x28;
          _effect->technique_count = effect->technique_count;
          pMVar8 = (MOJOSHADER_effectTechnique *)(*m_00)(uVar2,d_00);
          _effect->techniques = pMVar8;
          if (_effect->techniques != (MOJOSHADER_effectTechnique *)0x0) {
            memset(_effect->techniques,0,(ulong)uVar2);
            for (k = 0; k < _effect->technique_count; k = k + 1) {
              sVar4 = strlen(effect->techniques[k].name);
              pcVar5 = (char *)(*m_00)((int)sVar4 + 1,d_00);
              if (pcVar5 == (char *)0x0) goto LAB_00135ef3;
              strcpy(pcVar5,effect->techniques[k].name);
              _effect->techniques[k].name = pcVar5;
              uVar2 = effect->techniques[k].pass_count * 0x28;
              _effect->techniques[k].pass_count = effect->techniques[k].pass_count;
              pMVar9 = (MOJOSHADER_effectPass *)(*m_00)(uVar2,d_00);
              _effect->techniques[k].passes = pMVar9;
              if (_effect->techniques[k].passes == (MOJOSHADER_effectPass *)0x0) goto LAB_00135ef3;
              memset(_effect->techniques[k].passes,0,(ulong)uVar2);
              for (local_20 = 0; local_20 < _effect->techniques[k].pass_count;
                  local_20 = local_20 + 1) {
                sVar4 = strlen(effect->techniques[k].passes[(int)local_20].name);
                pcVar5 = (char *)(*m_00)((int)sVar4 + 1,d_00);
                if (pcVar5 == (char *)0x0) goto LAB_00135ef3;
                strcpy(pcVar5,effect->techniques[k].passes[(int)local_20].name);
                _effect->techniques[k].passes[(int)local_20].name = pcVar5;
                uVar2 = effect->techniques[k].passes[(int)local_20].state_count * 0x48;
                _effect->techniques[k].passes[(int)local_20].state_count =
                     effect->techniques[k].passes[(int)local_20].state_count;
                pMVar10 = (MOJOSHADER_effectState *)(*m_00)(uVar2,d_00);
                _effect->techniques[k].passes[(int)local_20].states = pMVar10;
                if (_effect->techniques[k].passes[(int)local_20].states ==
                    (MOJOSHADER_effectState *)0x0) goto LAB_00135ef3;
                memset(_effect->techniques[k].passes[(int)local_20].states,0,(ulong)uVar2);
                for (clone._4_4_ = 0;
                    clone._4_4_ < _effect->techniques[k].passes[(int)local_20].state_count;
                    clone._4_4_ = clone._4_4_ + 1) {
                  _effect->techniques[k].passes[(int)local_20].states[(int)clone._4_4_].type =
                       effect->techniques[k].passes[(int)local_20].states[(int)clone._4_4_].type;
                  copyvalue(&_effect->techniques[k].passes[(int)local_20].states[(int)clone._4_4_].
                             value,&effect->techniques[k].passes[(int)local_20].states
                                    [(int)clone._4_4_].value,m_00,d_00);
                }
                uVar2 = effect->techniques[k].passes[(int)local_20].annotation_count << 6;
                _effect->techniques[k].passes[(int)local_20].annotation_count =
                     effect->techniques[k].passes[(int)local_20].annotation_count;
                pMVar7 = (MOJOSHADER_effectAnnotation *)(*m_00)(uVar2,d_00);
                _effect->techniques[k].passes[(int)local_20].annotations = pMVar7;
                if (_effect->techniques[k].passes[(int)local_20].annotations ==
                    (MOJOSHADER_effectAnnotation *)0x0) goto LAB_00135ef3;
                memset(_effect->techniques[k].passes[(int)local_20].annotations,0,(ulong)uVar2);
                for (clone._4_4_ = 0;
                    clone._4_4_ < _effect->techniques[k].passes[(int)local_20].annotation_count;
                    clone._4_4_ = clone._4_4_ + 1) {
                  copyvalue(_effect->techniques[k].passes[(int)local_20].annotations +
                            (int)clone._4_4_,
                            effect->techniques[k].passes[(int)local_20].annotations +
                            (int)clone._4_4_,m_00,d_00);
                }
              }
              uVar2 = effect->techniques[k].annotation_count << 6;
              _effect->techniques[k].annotation_count = effect->techniques[k].annotation_count;
              pMVar7 = (MOJOSHADER_effectAnnotation *)(*m_00)(uVar2,d_00);
              _effect->techniques[k].annotations = pMVar7;
              if (_effect->techniques[k].annotations == (MOJOSHADER_effectAnnotation *)0x0)
              goto LAB_00135ef3;
              memset(_effect->techniques[k].annotations,0,(ulong)uVar2);
              for (local_20 = 0; local_20 < _effect->techniques[k].annotation_count;
                  local_20 = local_20 + 1) {
                copyvalue(_effect->techniques[k].annotations + (int)local_20,
                          effect->techniques[k].annotations + (int)local_20,m_00,d_00);
              }
            }
            for (k = 0; k < effect->technique_count; k = k + 1) {
              if (effect->techniques + k == effect->current_technique) {
                _effect->current_technique = _effect->techniques + k;
                break;
              }
            }
            if (_effect->current_technique == (MOJOSHADER_effectTechnique *)0x0) {
              __assert_fail("clone->current_technique != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                            ,0x626,
                            "MOJOSHADER_effect *MOJOSHADER_cloneEffect(const MOJOSHADER_effect *)");
            }
            _effect->current_pass = effect->current_pass;
            if (_effect->current_pass != -1) {
              __assert_fail("clone->current_pass == -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                            ,0x628,
                            "MOJOSHADER_effect *MOJOSHADER_cloneEffect(const MOJOSHADER_effect *)");
            }
            uVar2 = effect->object_count * 0x48;
            _effect->object_count = effect->object_count;
            pMVar11 = (MOJOSHADER_effectObject *)(*m_00)(uVar2,d_00);
            _effect->objects = pMVar11;
            if (_effect->objects != (MOJOSHADER_effectObject *)0x0) {
              memset(_effect->objects,0,(ulong)uVar2);
              k = 0;
              do {
                if (_effect->object_count <= k) {
                  return _effect;
                }
                _effect->objects[k].type = effect->objects[k].type;
                if ((_effect->objects[k].type == MOJOSHADER_SYMTYPE_PIXELSHADER) ||
                   (_effect->objects[k].type == MOJOSHADER_SYMTYPE_VERTEXSHADER)) {
                  *(undefined4 *)((long)_effect->objects + (long)k * 0x48 + 4) =
                       *(undefined4 *)((long)effect->objects + (long)k * 0x48 + 4);
                  *(undefined4 *)((long)_effect->objects + (long)k * 0x48 + 8) =
                       *(undefined4 *)((long)effect->objects + (long)k * 0x48 + 8);
                  *(undefined4 *)((long)_effect->objects + (long)k * 0x48 + 0xc) =
                       *(undefined4 *)((long)effect->objects + (long)k * 0x48 + 0xc);
                  uVar2 = *(int *)((long)effect->objects + (long)k * 0x48 + 0x10) << 2;
                  *(undefined4 *)((long)_effect->objects + (long)k * 0x48 + 0x10) =
                       *(undefined4 *)((long)effect->objects + (long)k * 0x48 + 0x10);
                  pvVar12 = (*m_00)(uVar2,d_00);
                  *(void **)((long)_effect->objects + (long)k * 0x48 + 0x18) = pvVar12;
                  memcpy(*(void **)((long)_effect->objects + (long)k * 0x48 + 0x18),
                         *(void **)((long)effect->objects + (long)k * 0x48 + 0x18),(ulong)uVar2);
                  uVar2 = *(int *)((long)effect->objects + (long)k * 0x48 + 0x20) << 2;
                  *(undefined4 *)((long)_effect->objects + (long)k * 0x48 + 0x20) =
                       *(undefined4 *)((long)effect->objects + (long)k * 0x48 + 0x20);
                  pvVar12 = (*m_00)(uVar2,d_00);
                  *(void **)((long)_effect->objects + (long)k * 0x48 + 0x28) = pvVar12;
                  memcpy(*(void **)((long)_effect->objects + (long)k * 0x48 + 0x28),
                         *(void **)((long)effect->objects + (long)k * 0x48 + 0x28),(ulong)uVar2);
                  if (*(int *)((long)_effect->objects + (long)k * 0x48 + 0xc) == 0) {
                    pMVar14 = copyparsedata(*(MOJOSHADER_parseData **)
                                             ((long)effect->objects + (long)k * 0x48 + 0x40),m_00,
                                            d_00);
                    *(MOJOSHADER_parseData **)((long)_effect->objects + (long)k * 0x48 + 0x40) =
                         pMVar14;
                    iVar1 = *(int *)((long)effect->objects + (long)k * 0x48 + 0x30);
                    *(undefined4 *)((long)_effect->objects + (long)k * 0x48 + 0x30) =
                         *(undefined4 *)((long)effect->objects + (long)k * 0x48 + 0x30);
                    pvVar12 = (*m_00)(iVar1 * 0x18,d_00);
                    *(void **)((long)_effect->objects + (long)k * 0x48 + 0x38) = pvVar12;
                    if (*(long *)((long)_effect->objects + (long)k * 0x48 + 0x38) == 0) break;
                    local_54 = 0;
                    for (local_20 = 0;
                        (int)local_20 <
                        *(int *)(*(long *)((long)_effect->objects + (long)k * 0x48 + 0x40) + 0xa0);
                        local_20 = local_20 + 1) {
                      if (*(int *)(*(long *)(*(long *)((long)_effect->objects +
                                                      (long)k * 0x48 + 0x40) + 0xa8) +
                                   (long)(int)local_20 * 0x38 + 8) == 3) {
                        *(undefined8 *)
                         (*(long *)((long)_effect->objects + (long)k * 0x48 + 0x38) +
                         (ulong)local_54 * 0x18) =
                             *(undefined8 *)
                              (*(long *)(*(long *)((long)_effect->objects + (long)k * 0x48 + 0x40) +
                                        0xa8) + (long)(int)local_20 * 0x38);
                        *(undefined4 *)
                         (*(long *)((long)_effect->objects + (long)k * 0x48 + 0x38) +
                          (ulong)local_54 * 0x18 + 8) =
                             *(undefined4 *)
                              (*(long *)(*(long *)((long)_effect->objects + (long)k * 0x48 + 0x40) +
                                        0xa8) + (long)(int)local_20 * 0x38 + 0xc);
                        *(uint *)(*(long *)((long)_effect->objects + (long)k * 0x48 + 0x38) +
                                  (ulong)local_54 * 0x18 + 0xc) =
                             _effect->params
                             [*(uint *)(*(long *)((long)_effect->objects + (long)k * 0x48 + 0x28) +
                                       (long)(int)local_20 * 4)].value.value_count;
                        *(anon_union_8_20_d40dc30a_for_MOJOSHADER_effectValue_4 *)
                         (*(long *)((long)_effect->objects + (long)k * 0x48 + 0x38) +
                          (ulong)local_54 * 0x18 + 0x10) =
                             _effect->params
                             [*(uint *)(*(long *)((long)_effect->objects + (long)k * 0x48 + 0x28) +
                                       (long)(int)local_20 * 4)].value.field_4;
                        local_54 = local_54 + 1;
                      }
                    }
                  }
                  else {
                    pMVar13 = copypreshader(*(MOJOSHADER_preshader **)
                                             ((long)effect->objects + (long)k * 0x48 + 0x40),m_00,
                                            d_00);
                    *(MOJOSHADER_preshader **)((long)_effect->objects + (long)k * 0x48 + 0x40) =
                         pMVar13;
                  }
                }
                else if (((_effect->objects[k].type == MOJOSHADER_SYMTYPE_SAMPLER) ||
                         (_effect->objects[k].type == MOJOSHADER_SYMTYPE_SAMPLER1D)) ||
                        ((_effect->objects[k].type == MOJOSHADER_SYMTYPE_SAMPLER2D ||
                         ((_effect->objects[k].type == MOJOSHADER_SYMTYPE_SAMPLER3D ||
                          (_effect->objects[k].type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)))))) {
                  sVar4 = strlen(*(char **)((long)effect->objects + (long)k * 0x48 + 8));
                  pcVar5 = (char *)(*m_00)((int)sVar4 + 1,d_00);
                  if (pcVar5 == (char *)0x0) break;
                  strcpy(pcVar5,*(char **)((long)effect->objects + (long)k * 0x48 + 8));
                  *(char **)((long)_effect->objects + (long)k * 0x48 + 8) = pcVar5;
                }
                else if (_effect->objects[k].type == MOJOSHADER_SYMTYPE_STRING) {
                  sVar4 = strlen(*(char **)((long)effect->objects + (long)k * 0x48 + 8));
                  pcVar5 = (char *)(*m_00)((int)sVar4 + 1,d_00);
                  if (pcVar5 == (char *)0x0) break;
                  strcpy(pcVar5,*(char **)((long)effect->objects + (long)k * 0x48 + 8));
                  *(char **)((long)_effect->objects + (long)k * 0x48 + 8) = pcVar5;
                }
                k = k + 1;
              } while( true );
            }
          }
        }
      }
    }
LAB_00135ef3:
    MOJOSHADER_freeEffect(_effect);
  }
  return (MOJOSHADER_effect *)0x0;
}

Assistant:

MOJOSHADER_effect *MOJOSHADER_cloneEffect(const MOJOSHADER_effect *effect)
{
    int i, j, k;
    MOJOSHADER_effect *clone;
    MOJOSHADER_malloc m = effect->malloc;
    void *d = effect->malloc_data;
    uint32 siz = 0;
    char *stringcopy = NULL;
    uint32 curSampler;

    if ((effect == NULL) || (effect == &MOJOSHADER_out_of_mem_effect))
        return NULL;  // no-op.

    clone = (MOJOSHADER_effect *) m(sizeof (MOJOSHADER_effect), d);
    if (clone == NULL)
        return NULL; // Maybe out_of_mem_effect instead?
    memset(clone, '\0', sizeof (MOJOSHADER_effect));

    /* Copy malloc/free */
    clone->malloc = effect->malloc;
    clone->free = effect->free;
    clone->malloc_data = effect->malloc_data;

    #define COPY_STRING(location) \
        siz = strlen(effect->location) + 1; \
        stringcopy = (char *) m(siz, d); \
        if (stringcopy == NULL) \
            goto cloneEffect_outOfMemory; \
        strcpy(stringcopy, effect->location); \
        clone->location = stringcopy; \

    /* Copy errors */
    siz = sizeof (MOJOSHADER_error) * effect->error_count;
    clone->error_count = effect->error_count;
    clone->errors = (MOJOSHADER_error *) m(siz, d);
    if (clone->errors == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->errors, '\0', siz);
    for (i = 0; i < clone->error_count; i++)
    {
        COPY_STRING(errors[i].error)
        COPY_STRING(errors[i].filename)
        clone->errors[i].error_position = effect->errors[i].error_position;
    } // for

    /* Copy profile string */
    COPY_STRING(profile)

    /* Copy parameters */
    siz = sizeof (MOJOSHADER_effectParam) * effect->param_count;
    clone->param_count = effect->param_count;
    clone->params = (MOJOSHADER_effectParam *) m(siz, d);
    if (clone->params == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->params, '\0', siz);
    for (i = 0; i < clone->param_count; i++)
    {
        copyvalue(&clone->params[i].value, &effect->params[i].value, m, d);

        /* Copy parameter annotations */
        siz = sizeof (MOJOSHADER_effectAnnotation) * effect->params[i].annotation_count;
        clone->params[i].annotation_count = effect->params[i].annotation_count;
        clone->params[i].annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
        if (clone->params[i].annotations == NULL)
            goto cloneEffect_outOfMemory;
        memset(clone->params[i].annotations, '\0', siz);
        for (j = 0; j < clone->params[i].annotation_count; j++)
            copyvalue(&clone->params[i].annotations[j],
                      &effect->params[i].annotations[j],
                      m, d);
    } // for

    /* Copy techniques */
    siz = sizeof (MOJOSHADER_effectTechnique) * effect->technique_count;
    clone->technique_count = effect->technique_count;
    clone->techniques = (MOJOSHADER_effectTechnique *) m(siz, d);
    if (clone->techniques == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->techniques, '\0', siz);
    for (i = 0; i < clone->technique_count; i++)
    {
        COPY_STRING(techniques[i].name)

        /* Copy passes */
        siz = sizeof (MOJOSHADER_effectPass) * effect->techniques[i].pass_count;
        clone->techniques[i].pass_count = effect->techniques[i].pass_count;
        clone->techniques[i].passes = (MOJOSHADER_effectPass *) m(siz, d);
        if (clone->techniques[i].passes == NULL)
            goto cloneEffect_outOfMemory;
        memset(clone->techniques[i].passes, '\0', siz);
        for (j = 0; j < clone->techniques[i].pass_count; j++)
        {
            COPY_STRING(techniques[i].passes[j].name)

            /* Copy pass states */
            siz = sizeof (MOJOSHADER_effectState) * effect->techniques[i].passes[j].state_count;
            clone->techniques[i].passes[j].state_count = effect->techniques[i].passes[j].state_count;
            clone->techniques[i].passes[j].states = (MOJOSHADER_effectState *) m(siz, d);
            if (clone->techniques[i].passes[j].states == NULL)
                goto cloneEffect_outOfMemory;
            memset(clone->techniques[i].passes[j].states, '\0', siz);
            for (k = 0; k < clone->techniques[i].passes[j].state_count; k++)
            {
                clone->techniques[i].passes[j].states[k].type = effect->techniques[i].passes[j].states[k].type;
                copyvalue(&clone->techniques[i].passes[j].states[k].value,
                          &effect->techniques[i].passes[j].states[k].value,
                          m, d);
            } // for

            /* Copy pass annotations */
            siz = sizeof (MOJOSHADER_effectAnnotation) * effect->techniques[i].passes[j].annotation_count;
            clone->techniques[i].passes[j].annotation_count = effect->techniques[i].passes[j].annotation_count;
            clone->techniques[i].passes[j].annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
            if (clone->techniques[i].passes[j].annotations == NULL)
                goto cloneEffect_outOfMemory;
            memset(clone->techniques[i].passes[j].annotations, '\0', siz);
            for (k = 0; k < clone->techniques[i].passes[j].annotation_count; k++)
                copyvalue(&clone->techniques[i].passes[j].annotations[k],
                          &effect->techniques[i].passes[j].annotations[k],
                          m, d);
        } // for

        /* Copy technique annotations */
        siz = sizeof (MOJOSHADER_effectAnnotation) * effect->techniques[i].annotation_count;
        clone->techniques[i].annotation_count = effect->techniques[i].annotation_count;
        clone->techniques[i].annotations = (MOJOSHADER_effectAnnotation *) m(siz, d);
        if (clone->techniques[i].annotations == NULL)
            goto cloneEffect_outOfMemory;
        memset(clone->techniques[i].annotations, '\0', siz);
        for (j = 0; j < clone->techniques[i].annotation_count; j++)
            copyvalue(&clone->techniques[i].annotations[j],
                      &effect->techniques[i].annotations[j],
                      m, d);
    } // for

    /* Copy the current technique/pass */
    for (i = 0; i < effect->technique_count; i++)
        if (&effect->techniques[i] == effect->current_technique)
        {
            clone->current_technique = &clone->techniques[i];
            break;
        } // if
    assert(clone->current_technique != NULL);
    clone->current_pass = effect->current_pass;
    assert(clone->current_pass == -1);

    /* Copy object table */
    siz = sizeof (MOJOSHADER_effectObject) * effect->object_count;
    clone->object_count = effect->object_count;
    clone->objects = (MOJOSHADER_effectObject *) m(siz, d);
    if (clone->objects == NULL)
        goto cloneEffect_outOfMemory;
    memset(clone->objects, '\0', siz);
    for (i = 0; i < clone->object_count; i++)
    {
        clone->objects[i].type = effect->objects[i].type;
        if (clone->objects[i].type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || clone->objects[i].type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            clone->objects[i].shader.technique = effect->objects[i].shader.technique;
            clone->objects[i].shader.pass = effect->objects[i].shader.pass;
            clone->objects[i].shader.is_preshader = effect->objects[i].shader.is_preshader;
            siz = sizeof (uint32) * effect->objects[i].shader.preshader_param_count;
            clone->objects[i].shader.preshader_param_count = effect->objects[i].shader.preshader_param_count;
            clone->objects[i].shader.preshader_params = (uint32 *) m(siz, d);
            memcpy(clone->objects[i].shader.preshader_params,
                   effect->objects[i].shader.preshader_params,
                   siz);
            siz = sizeof (uint32) * effect->objects[i].shader.param_count;
            clone->objects[i].shader.param_count = effect->objects[i].shader.param_count;
            clone->objects[i].shader.params = (uint32 *) m(siz, d);
            memcpy(clone->objects[i].shader.params,
                   effect->objects[i].shader.params,
                   siz);

            if (clone->objects[i].shader.is_preshader)
            {
                clone->objects[i].shader.preshader = copypreshader(effect->objects[i].shader.preshader,
                                                                   m, d);
                continue;
            } // if

            clone->objects[i].shader.shader = copyparsedata(effect->objects[i].shader.shader,
                                                            m, d);

            siz = sizeof (MOJOSHADER_samplerStateRegister) * effect->objects[i].shader.sampler_count;
            clone->objects[i].shader.sampler_count = effect->objects[i].shader.sampler_count;
            clone->objects[i].shader.samplers = (MOJOSHADER_samplerStateRegister *) m(siz, d);
            if (clone->objects[i].shader.samplers == NULL)
                goto cloneEffect_outOfMemory;
            curSampler = 0;
            for (j = 0; j < clone->objects[i].shader.shader->symbol_count; j++)
                if (clone->objects[i].shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                {
                    clone->objects[i].shader.samplers[curSampler].sampler_name = clone->objects[i].shader.shader->symbols[j].name;
                    clone->objects[i].shader.samplers[curSampler].sampler_register = clone->objects[i].shader.shader->symbols[j].register_index;
                    clone->objects[i].shader.samplers[curSampler].sampler_state_count = clone->params[clone->objects[i].shader.params[j]].value.value_count;
                    clone->objects[i].shader.samplers[curSampler].sampler_states = clone->params[clone->objects[i].shader.params[j]].value.valuesSS;
                    curSampler++;
                } // if
        } // if
        else if (clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER1D
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER2D
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLER3D
              || clone->objects[i].type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            COPY_STRING(objects[i].mapping.name)
        } // else if
        else if (clone->objects[i].type == MOJOSHADER_SYMTYPE_STRING)
        {
            COPY_STRING(objects[i].string.string)
        } // else if
    } // for

    #undef COPY_STRING

    return clone;

cloneEffect_outOfMemory:
    MOJOSHADER_freeEffect(clone);
    return NULL;
}